

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

bool soul::isFollowedByBlankLine(CodeLocation *pos)

{
  _Alloc_hider _Var1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  bool bVar5;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  CodeLocation local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  CodeLocation::getSourceLine_abi_cxx11_(&local_60,pos);
  if (local_60._M_string_length != 0) {
    psVar2 = &local_60._M_string_length;
    sVar4 = local_60._M_string_length;
    do {
      if ((4 < (byte)local_60._M_dataplus._M_p[sVar4 - 1] - 9) &&
         (local_60._M_dataplus._M_p[sVar4 - 1] != 0x20)) {
        paVar3 = &local_60.field_2;
        local_60._M_dataplus._M_p[sVar4] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == paVar3) {
          local_70._8_8_ = local_60.field_2._8_8_;
          local_60._M_dataplus._M_p = (pointer)&local_70;
        }
        local_70._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
        local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_60._M_dataplus._M_p;
        local_78 = sVar4;
        local_60._M_dataplus._M_p = (pointer)paVar3;
        local_60._M_string_length = sVar4;
        goto LAB_001ccd47;
      }
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  paVar3 = &local_70;
  psVar2 = &local_78;
  local_80 = paVar3;
LAB_001ccd47:
  *psVar2 = 0;
  paVar3->_M_local_buf[0] = '\0';
  if (local_78 == 0) {
    bVar5 = true;
  }
  else {
    CodeLocation::getStartOfNextLine(&local_40);
    CodeLocation::getSourceLine_abi_cxx11_(&local_a0,&local_40);
    for (local_28 = local_a0._M_string_length; local_28 != 0; local_28 = local_28 - 1) {
      if ((4 < (byte)local_a0._M_dataplus._M_p[local_28 - 1] - 9) &&
         (local_a0._M_dataplus._M_p[local_28 - 1] != 0x20)) {
        _Var1._M_p = (pointer)&local_a0.field_2;
        local_a0._M_dataplus._M_p[local_28] = '\0';
        if (local_a0._M_dataplus._M_p == _Var1._M_p) {
          local_20._8_8_ = local_a0.field_2._8_8_;
          local_a0._M_dataplus._M_p = (pointer)&local_20;
        }
        local_20._M_allocated_capacity._1_7_ = local_a0.field_2._M_allocated_capacity._1_7_;
        local_20._M_local_buf[0] = local_a0.field_2._M_local_buf[0];
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        bVar5 = local_28 == 0;
        local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_a0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == &local_20) goto LAB_001cce0f;
        local_a0._M_dataplus._M_p = _Var1._M_p;
        operator_delete(local_30,local_20._M_allocated_capacity + 1);
        goto LAB_001ccdf8;
      }
    }
    local_30 = &local_20;
    local_28 = 0;
    local_20._M_allocated_capacity = local_20._M_allocated_capacity & 0xffffffffffffff00;
    bVar5 = true;
LAB_001ccdf8:
    _Var1._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
      _Var1._M_p = local_a0._M_dataplus._M_p;
    }
LAB_001cce0f:
    local_a0._M_dataplus._M_p = _Var1._M_p;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.sourceCode.object);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

static bool isFollowedByBlankLine (CodeLocation pos)
{
    return choc::text::trimEnd (pos.getSourceLine()).empty()
        || choc::text::trimEnd (pos.getStartOfNextLine().getSourceLine()).empty();
}